

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LinearConHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLinearConExpr
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int con_index,
          int num_linear_terms)

{
  pointer this_00;
  MutAlgebraicCon local_20;
  
  BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::MutAlgebraicCon
            (&local_20,this->builder_,con_index);
  this_00 = ((local_20.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
            algebraic_cons_).
            super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
            ._M_impl.super__Vector_impl_data._M_start +
            local_20.
            super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)this_00,
             (long)num_linear_terms);
  BasicProblem<mp::BasicProblemParams<int>_>::LinearExprBuilder::LinearExprBuilder
            ((LinearExprBuilder *)&local_20,&this_00->linear_expr);
  return (LinearConHandler)
         (LinearExpr *)
         local_20.
         super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
}

Assistant:

LinearConHandler OnLinearConExpr(int con_index, int num_linear_terms) {
    return builder_.algebraic_con(con_index).set_linear_expr(num_linear_terms);
  }